

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# esextcTextureBufferOperations.cpp
# Opt level: O2

string * __thiscall
glcts::TextureBufferOperations::getFragmentShaderCode_abi_cxx11_
          (string *__return_storage_ptr__,TextureBufferOperations *this)

{
  stringstream strstream;
  stringstream local_190 [16];
  ostream local_180;
  
  std::__cxx11::stringstream::stringstream(local_190);
  std::operator<<(&local_180,
                  "${VERSION}\n\n${TEXTURE_BUFFER_REQUIRE}\n\nprecision highp float;\n\nin float fs_index;\n\nlayout(location = 0) out ivec4 color;\n\nuniform highp isamplerBuffer sampler_buffer;\n\nvoid main(void)\n{\n    color = texelFetch( sampler_buffer, int(fs_index) );\n }\n"
                 );
  std::__cxx11::stringbuf::str();
  std::__cxx11::stringstream::~stringstream(local_190);
  return __return_storage_ptr__;
}

Assistant:

std::string TextureBufferOperations::getFragmentShaderCode() const
{
	std::stringstream strstream;

	strstream << "${VERSION}\n"
				 "\n"
				 "${TEXTURE_BUFFER_REQUIRE}\n"
				 "\n"
				 "precision highp float;\n"
				 "\n"
				 "in float fs_index;\n"
				 "\n"
				 "layout(location = 0) out ivec4 color;\n"
				 "\n"
				 "uniform highp isamplerBuffer sampler_buffer;\n"
				 "\n"
				 "void main(void)\n"
				 "{\n"
				 "    color = texelFetch( sampler_buffer, int(fs_index) );\n "
				 "}\n";

	return strstream.str();
}